

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathVector3.h
# Opt level: O0

Vector3 * __thiscall COLLADABU::Math::Vector3::crossProduct(Vector3 *this,Vector3 *rkVector)

{
  double *in_RDX;
  double *in_RSI;
  Vector3 *in_RDI;
  Vector3 *kCross;
  
  Vector3(in_RDI);
  (in_RDI->field_0).field_0.x = in_RSI[1] * in_RDX[2] + -(in_RSI[2] * in_RDX[1]);
  (in_RDI->field_0).field_0.y = in_RSI[2] * *in_RDX + -(*in_RSI * in_RDX[2]);
  (in_RDI->field_0).field_0.z = *in_RSI * in_RDX[1] + -(in_RSI[1] * *in_RDX);
  return in_RDI;
}

Assistant:

inline Vector3 crossProduct( const Vector3& rkVector ) const
            {
                Vector3 kCross;

                kCross.x = y * rkVector.z - z * rkVector.y;
                kCross.y = z * rkVector.x - x * rkVector.z;
                kCross.z = x * rkVector.y - y * rkVector.x;

                return kCross;
            }